

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-test.c++
# Opt level: O3

Own<kj::File> kj::anon_unknown_0::newTempFile(void)

{
  int iVar1;
  Disposer *pDVar2;
  undefined4 extraout_var_00;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *pFVar3;
  kj *in_RDI;
  Own<kj::File> OVar4;
  Fault f;
  char filename [35];
  Fault local_68;
  AutoCloseFd local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  char local_48 [48];
  undefined4 extraout_var;
  
  builtin_strncpy(local_48,"/var/tmp/kj-filesystem-test.XXXXXX",0x23);
  do {
    local_60.fd = mkstemp(local_48);
    if (-1 < local_60.fd) goto LAB_00245a0c;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_68.exception = (Exception *)0x0;
    local_58 = 0;
    uStack_50 = 0;
    _::Debug::Fault::init
              (&local_68,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
              );
    _::Debug::Fault::fatal(&local_68);
  }
LAB_00245a0c:
  UnwindDetector::UnwindDetector(&local_60.unwindDetector);
  newDiskFile(in_RDI,&local_60);
  AutoCloseFd::~AutoCloseFd(&local_60);
  do {
    iVar1 = unlink(local_48);
    pDVar2 = (Disposer *)CONCAT44(extraout_var,iVar1);
    pFVar3 = extraout_RDX;
    if (-1 < iVar1) goto LAB_00245a51;
    iVar1 = _::Debug::getOsErrorNumber(false);
    pDVar2 = (Disposer *)CONCAT44(extraout_var_00,iVar1);
  } while (iVar1 == -1);
  pFVar3 = extraout_RDX_00;
  if (iVar1 != 0) {
    local_68.exception = (Exception *)0x0;
    local_58 = 0;
    uStack_50 = 0;
    _::Debug::Fault::init
              (&local_68,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
              );
    _::Debug::Fault::fatal(&local_68);
  }
LAB_00245a51:
  OVar4.ptr = pFVar3;
  OVar4.disposer = pDVar2;
  return OVar4;
}

Assistant:

static Own<File> newTempFile() {
  char filename[] = VAR_TMP "/kj-filesystem-test.XXXXXX";
  int fd;
  KJ_SYSCALL(fd = mkstemp(filename));
  KJ_DEFER(KJ_SYSCALL(unlink(filename)));
  return newDiskFile(AutoCloseFd(fd));
}